

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O3

void __thiscall setup::language_entry::load(language_entry *this,istream *is,info *i)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  codepage_id codepage;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  char buffer [4];
  uint local_2c;
  
  if (0x3ffffff < (i->version).value) {
    util::binary_string::load(is,&this->name);
  }
  util::binary_string::load(is,&this->language_name);
  if ((i->version).value == 0x5050701) {
    util::binary_string::skip(is);
  }
  util::binary_string::load(is,&this->dialog_font);
  util::binary_string::load(is,&this->title_font);
  util::binary_string::load(is,&this->welcome_font);
  util::binary_string::load(is,&this->copyright_font);
  if (((i->version).value < 0x4000000) ||
     (util::binary_string::load(is,&this->data), (i->version).value < 0x4000100)) {
    (this->license_text)._M_string_length = 0;
    *(this->license_text)._M_dataplus._M_p = '\0';
    (this->info_before)._M_string_length = 0;
    *(this->info_before)._M_dataplus._M_p = '\0';
    (this->info_after)._M_string_length = 0;
    *(this->info_after)._M_dataplus._M_p = '\0';
  }
  else {
    util::binary_string::load(is,&this->license_text);
    util::binary_string::load(is,&this->info_before);
    util::binary_string::load(is,&this->info_after);
  }
  std::istream::read((char *)is,(long)&local_2c);
  this->language_id = local_2c;
  uVar2 = (i->version).value;
  if (uVar2 < 0x4020200) {
    uVar3 = 0x39;
    puVar1 = (anonymous_namespace)::languages;
    do {
      uVar4 = uVar3 >> 1;
      uVar5 = ~uVar4 + uVar3;
      uVar3 = uVar4;
      if (*(ushort *)((long)puVar1 + uVar4 * 2 * 2) < local_2c) {
        puVar1 = (undefined1 *)((ushort *)((long)puVar1 + uVar4 * 2 * 2) + 2);
        uVar3 = uVar5;
      }
    } while (0 < (long)uVar3);
    uVar2 = 0x4e4;
    if ((puVar1 != &DAT_00157b24) && (local_2c == *(ushort *)puVar1)) {
      uVar2 = (uint)*(ushort *)((long)puVar1 + 2);
    }
  }
  else {
    if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 2) != 0) {
      if (uVar2 < 0x5030000) {
        std::istream::read((char *)is,(long)&local_2c);
      }
      this->codepage = 0x4b0;
      uVar2 = 0x4b0;
      goto LAB_00141a33;
    }
    std::istream::read((char *)is,(long)&local_2c);
    uVar2 = 0x4e4;
    if (local_2c != 0) {
      uVar2 = local_2c;
    }
  }
  this->codepage = uVar2;
LAB_00141a33:
  codepage = 0x4b0;
  if ((i->version).value < 0x4020200) {
    codepage = uVar2;
  }
  sVar6 = 0;
  util::to_utf8(&this->language_name,codepage,(bitset<256UL> *)0x0);
  std::istream::read((char *)is,(long)&local_2c);
  this->dialog_font_size = (ulong)local_2c;
  if ((i->version).value < 0x4010000) {
    std::istream::read((char *)is,(long)&local_2c);
    sVar6 = (size_t)local_2c;
  }
  this->dialog_font_standard_height = sVar6;
  std::istream::read((char *)is,(long)&local_2c);
  this->title_font_size = (ulong)local_2c;
  std::istream::read((char *)is,(long)&local_2c);
  this->welcome_font_size = (ulong)local_2c;
  std::istream::read((char *)is,(long)&local_2c);
  this->copyright_font_size = (ulong)local_2c;
  uVar2 = (i->version).value;
  if (uVar2 == 0x5050701) {
    std::istream::read((char *)is,(long)&local_2c);
    uVar2 = (i->version).value;
  }
  if (uVar2 < 0x5020300) {
    bVar7 = false;
  }
  else {
    std::istream::read((char *)is,(long)&local_2c);
    bVar7 = (char)local_2c != '\0';
  }
  this->right_to_left = bVar7;
  return;
}

Assistant:

void language_entry::load(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(name);
	}
	
	is >> util::binary_string(language_name);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::binary_string::skip(is);
	}
	
	is >> util::binary_string(dialog_font);
	is >> util::binary_string(title_font);
	is >> util::binary_string(welcome_font);
	is >> util::binary_string(copyright_font);
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(data);
	}
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::binary_string(license_text);
		is >> util::binary_string(info_before);
		is >> util::binary_string(info_after);
	} else {
		license_text.clear(), info_before.clear(), info_after.clear();
	}
	
	language_id = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 2, 2)) {
		codepage = default_codepage_for_language(language_id);
	} else if(!i.version.is_unicode()) {
		codepage = util::load<boost::uint32_t>(is);
		if(!codepage) {
			codepage = util::cp_windows1252;
		}
	} else {
		if(i.version < INNO_VERSION(5, 3, 0)) {
			(void)util::load<boost::uint32_t>(is);
		}
		codepage = util::cp_utf16le;
	}
	
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		util::to_utf8(language_name, util::cp_utf16le);
	} else {
		util::to_utf8(language_name, codepage);
	}
	
	dialog_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 1, 0)) {
		dialog_font_standard_height = util::load<boost::uint32_t>(is);
	} else {
		dialog_font_standard_height = 0;
	}
	
	title_font_size = util::load<boost::uint32_t>(is);
	welcome_font_size = util::load<boost::uint32_t>(is);
	copyright_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::load<boost::uint32_t>(is); // always 8 or 9?
	}
	
	if(i.version >= INNO_VERSION(5, 2, 3)) {
		right_to_left = util::load_bool(is);
	} else {
		right_to_left = false;
	}
	
}